

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O0

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::LValueReferenceExpression>
          (SampledValueFuncVisitor *this,LValueReferenceExpression *expr)

{
  SourceRange sourceRange;
  string_view arg;
  bool bVar1;
  KnownSystemName KVar2;
  size_type sVar3;
  reference ppEVar4;
  Expression *in_RSI;
  CallExpression *in_RDI;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar5;
  bool hasClock;
  CallExpression *call;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  AnalysisContext *in_stack_ffffffffffffff78;
  SourceLocation in_stack_ffffffffffffff80;
  Expression *in_stack_ffffffffffffff88;
  Diagnostic *in_stack_ffffffffffffffa0;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_40;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_30;
  bool local_19;
  CallExpression *local_18;
  Expression *local_10;
  
  local_10 = in_RSI;
  bVar1 = ClockInference::isSampledValueFuncCall(in_stack_ffffffffffffff88);
  if (bVar1) {
    local_18 = ast::Expression::as<slang::ast::CallExpression>(local_10);
    KVar2 = ast::CallExpression::getKnownSystemName
                      ((CallExpression *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
    if (KVar2 == Past) {
      local_30 = ast::CallExpression::arguments((CallExpression *)0x80498e);
      sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         0x8049a5);
      local_19 = false;
      if (sVar3 == 4) {
        local_40 = ast::CallExpression::arguments((CallExpression *)0x8049c1);
        ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (&local_40,3);
        local_19 = (*ppEVar4)->kind != EmptyArgument;
      }
    }
    else {
      sVar5 = ast::CallExpression::arguments((CallExpression *)0x804a03);
      in_stack_ffffffffffffffb0 = sVar5._M_ptr;
      sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         0x804a17);
      local_19 = false;
      if (sVar3 == 2) {
        sVar5 = ast::CallExpression::arguments((CallExpression *)0x804a33);
        in_stack_ffffffffffffffa0 = (Diagnostic *)sVar5._M_ptr;
        in_stack_ffffffffffffffa8 = sVar5._M_extent._M_extent_value;
        ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             &stack0xffffffffffffffa0,1);
        local_19 = (*ppEVar4)->kind != EmptyArgument;
      }
    }
    if (local_19 == false) {
      sourceRange.endLoc = (local_18->super_Expression).sourceRange.startLoc;
      sourceRange.startLoc = in_stack_ffffffffffffff80;
      AnalysisContext::addDiag
                (in_stack_ffffffffffffff78,(Symbol *)in_RDI,
                 SUB84((local_18->super_Expression).sourceRange.endLoc,4),sourceRange);
      ast::CallExpression::getSubroutineName(in_RDI);
      arg._M_str = (char *)in_stack_ffffffffffffffb0;
      arg._M_len = in_stack_ffffffffffffffa8._M_extent_value;
      Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }